

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O0

void __thiscall node::SnapshotMetadata::Unserialize<AutoFile>(SnapshotMetadata *this,AutoFile *s)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  iterator fmt;
  _Optional_payload_base<ChainType> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string *psVar4;
  error_code *this_00;
  long in_FS_OFFSET;
  uint16_t version;
  optional<ChainType> node_network;
  optional<ChainType> metadata_network;
  MessageStartChars message;
  array<unsigned_char,_5UL> snapshot_magic;
  string node_network_string;
  string network_string;
  optional<ChainType> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  io_errc in_stack_fffffffffffffe94;
  AutoFile *in_stack_fffffffffffffe98;
  array<unsigned_char,_5UL> *in_stack_fffffffffffffea0;
  error_code *peVar5;
  array<unsigned_char,_5UL> *in_stack_fffffffffffffea8;
  unsigned_short *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffed8;
  ChainType chain;
  MessageStartChars *in_stack_ffffffffffffff20;
  
  chain = (ChainType)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::operator>>
            (in_stack_fffffffffffffe98,
             (array<unsigned_char,_5UL> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  bVar2 = std::operator==(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    AutoFile::operator>>
              (in_stack_fffffffffffffe98,
               (unsigned_short *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::find
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (key_type_conflict1 *)in_stack_fffffffffffffe88);
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::end
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe98,
                            (_Self *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (bVar2) {
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      tinyformat::format<unsigned_short>(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::ios_base::failure[abi:cxx11]::failure(psVar4);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(psVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
    else {
      AutoFile::operator>>
                (in_stack_fffffffffffffe98,
                 (array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      fmt = std::array<unsigned_char,_4UL>::begin
                      ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe88);
      std::array<unsigned_char,_4UL>::end((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe88);
      std::array<unsigned_char,_4UL>::data((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe88);
      bVar2 = std::equal<unsigned_char*,unsigned_char_const*>
                        ((uchar *)in_stack_fffffffffffffe98,
                         (uchar *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         (uchar *)in_stack_fffffffffffffe88);
      if (bVar2) {
        AutoFile::operator>>
                  (in_stack_fffffffffffffe98,
                   (uint256 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        AutoFile::operator>>
                  (in_stack_fffffffffffffe98,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
      }
      else {
        GetNetworkForMagic(in_stack_ffffffffffffff20);
        bVar2 = std::optional::operator_cast_to_bool(in_stack_fffffffffffffe88);
        if (bVar2) {
          std::optional<ChainType>::value((optional<ChainType> *)in_stack_fffffffffffffe98);
          ChainTypeToString_abi_cxx11_(chain);
          args = (_Optional_payload_base<ChainType>)GetNetworkForMagic(in_stack_ffffffffffffff20);
          args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::optional<ChainType>::value((optional<ChainType> *)in_stack_fffffffffffffe98)
          ;
          ChainTypeToString_abi_cxx11_(chain);
          psVar4 = (string *)__cxa_allocate_exception(0x20);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    ((char *)fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                     args_1);
          std::ios_base::failure[abi:cxx11]::failure(psVar4);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(psVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
        else {
          this_00 = (error_code *)__cxa_allocate_exception(0x20);
          peVar5 = this_00;
          std::error_code::error_code<std::io_errc,void>(this_00,in_stack_fffffffffffffe94);
          std::ios_base::failure[abi:cxx11]::failure
                    ((char *)peVar5,
                     (error_code *)
                     "This snapshot has been created for an unrecognized network. This could be a custom signet, a new testnet or possibly caused by data corruption."
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
    }
  }
  else {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              ((error_code *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)
                      "Invalid UTXO set snapshot magic bytes. Please check if this is indeed a snapshot file or if you are using an outdated snapshot format."
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Read the snapshot magic bytes
        std::array<uint8_t, SNAPSHOT_MAGIC_BYTES.size()> snapshot_magic;
        s >> snapshot_magic;
        if (snapshot_magic != SNAPSHOT_MAGIC_BYTES) {
            throw std::ios_base::failure("Invalid UTXO set snapshot magic bytes. Please check if this is indeed a snapshot file or if you are using an outdated snapshot format.");
        }

        // Read the version
        uint16_t version;
        s >> version;
        if (m_supported_versions.find(version) == m_supported_versions.end()) {
            throw std::ios_base::failure(strprintf("Version of snapshot %s does not match any of the supported versions.", version));
        }

        // Read the network magic (pchMessageStart)
        MessageStartChars message;
        s >> message;
        if (!std::equal(message.begin(), message.end(), m_network_magic.data())) {
            auto metadata_network{GetNetworkForMagic(message)};
            if (metadata_network) {
                std::string network_string{ChainTypeToString(metadata_network.value())};
                auto node_network{GetNetworkForMagic(m_network_magic)};
                std::string node_network_string{ChainTypeToString(node_network.value())};
                throw std::ios_base::failure(strprintf("The network of the snapshot (%s) does not match the network of this node (%s).", network_string, node_network_string));
            } else {
                throw std::ios_base::failure("This snapshot has been created for an unrecognized network. This could be a custom signet, a new testnet or possibly caused by data corruption.");
            }
        }

        s >> m_base_blockhash;
        s >> m_coins_count;
    }